

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O1

int hydro_hash_hash(uint8_t *out,size_t out_len,void *in_,size_t in_len,char *ctx,uint8_t *key)

{
  int iVar1;
  hydro_hash_state st;
  hydro_hash_state local_5c;
  
  hydro_hash_init(&local_5c,ctx,key);
  hydro_hash_update(&local_5c,in_,in_len);
  iVar1 = hydro_hash_final(&local_5c,out,out_len);
  return -(uint)(iVar1 != 0);
}

Assistant:

int
hydro_hash_hash(uint8_t *out, size_t out_len, const void *in_, size_t in_len,
                const char ctx[hydro_hash_CONTEXTBYTES], const uint8_t key[hydro_hash_KEYBYTES])
{
    hydro_hash_state st;
    const uint8_t   *in = (const uint8_t *) in_;

    if (hydro_hash_init(&st, ctx, key) != 0 || hydro_hash_update(&st, in, in_len) != 0 ||
        hydro_hash_final(&st, out, out_len) != 0) {
        return -1;
    }
    return 0;
}